

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

Ivy_Obj_t * Ivy_ObjRecognizeMux(Ivy_Obj_t *pNode,Ivy_Obj_t **ppNodeT,Ivy_Obj_t **ppNodeE)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  int iVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x208,"Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)");
  }
  iVar5 = Ivy_ObjIsMuxType(pNode);
  if (iVar5 != 0) {
    uVar6 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe;
    uVar8 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe;
    uVar2 = *(ulong *)(uVar6 + 0x10);
    iVar11 = 0;
    iVar5 = 0;
    if (uVar2 != 0) {
      iVar5 = *(int *)(uVar2 & 0xfffffffffffffffe);
    }
    uVar3 = *(ulong *)(uVar8 + 0x10);
    if (uVar3 != 0) {
      iVar11 = *(int *)(uVar3 & 0xfffffffffffffffe);
    }
    puVar7 = (ulong *)(uVar6 + 0x10);
    puVar1 = (ulong *)(uVar8 + 0x10);
    puVar10 = puVar7;
    if ((iVar5 == iVar11) && (((uint)uVar2 & 1) != ((uint)uVar3 & 1))) {
      if ((uVar2 & 1) == 0) {
        *ppNodeT = (Ivy_Obj_t *)(*(ulong *)(uVar6 + 0x18) ^ 1);
        puVar7 = (ulong *)(uVar8 + 0x18);
      }
      else {
        *ppNodeT = (Ivy_Obj_t *)(*(ulong *)(uVar8 + 0x18) ^ 1);
        puVar10 = puVar1;
        puVar7 = (ulong *)(uVar6 + 0x18);
      }
    }
    else {
      iVar11 = 0;
      iVar5 = 0;
      if (uVar2 != 0) {
        iVar5 = *(int *)(uVar2 & 0xfffffffffffffffe);
      }
      uVar4 = *(ulong *)(uVar8 + 0x18);
      if (uVar4 != 0) {
        iVar11 = *(int *)(uVar4 & 0xfffffffffffffffe);
      }
      puVar9 = (ulong *)(uVar8 + 0x18);
      if ((iVar5 == iVar11) && (((uint)uVar2 & 1) != ((uint)uVar4 & 1))) {
        if ((uVar2 & 1) == 0) {
          *ppNodeT = (Ivy_Obj_t *)(*(ulong *)(uVar6 + 0x18) ^ 1);
          puVar7 = puVar1;
        }
        else {
          *ppNodeT = (Ivy_Obj_t *)(uVar3 ^ 1);
          puVar7 = (ulong *)(uVar6 + 0x18);
          puVar10 = puVar9;
        }
      }
      else {
        uVar8 = *(ulong *)(uVar6 + 0x18);
        iVar11 = 0;
        iVar5 = 0;
        if (uVar8 != 0) {
          iVar5 = *(int *)(uVar8 & 0xfffffffffffffffe);
        }
        if (uVar3 != 0) {
          iVar11 = *(int *)(uVar3 & 0xfffffffffffffffe);
        }
        puVar10 = (ulong *)(uVar6 + 0x18);
        if ((iVar5 == iVar11) && (((uint)uVar8 & 1) != ((uint)uVar3 & 1))) {
          if ((uVar8 & 1) == 0) {
            *ppNodeT = (Ivy_Obj_t *)(uVar2 ^ 1);
            puVar7 = puVar9;
          }
          else {
            *ppNodeT = (Ivy_Obj_t *)(uVar4 ^ 1);
            puVar10 = puVar1;
          }
        }
        else {
          iVar11 = 0;
          iVar5 = 0;
          if (uVar8 != 0) {
            iVar5 = *(int *)(uVar8 & 0xfffffffffffffffe);
          }
          if (uVar4 != 0) {
            iVar11 = *(int *)(uVar4 & 0xfffffffffffffffe);
          }
          if ((iVar5 != iVar11) || (((uint)uVar8 & 1) == ((uint)uVar4 & 1))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                          ,0x252,
                          "Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)")
            ;
          }
          if ((uVar8 & 1) == 0) {
            *ppNodeT = (Ivy_Obj_t *)(uVar2 ^ 1);
            puVar7 = puVar1;
          }
          else {
            *ppNodeT = (Ivy_Obj_t *)(uVar3 ^ 1);
            puVar10 = puVar9;
          }
        }
      }
    }
    *ppNodeE = (Ivy_Obj_t *)(*puVar7 ^ 1);
    return (Ivy_Obj_t *)*puVar10;
  }
  __assert_fail("Ivy_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                ,0x209,"Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)");
}

Assistant:

Ivy_Obj_t * Ivy_ObjRecognizeMux( Ivy_Obj_t * pNode, Ivy_Obj_t ** ppNodeT, Ivy_Obj_t ** ppNodeE )
{
    Ivy_Obj_t * pNode0, * pNode1;
    assert( !Ivy_IsComplement(pNode) );
    assert( Ivy_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    // find the control variable
//    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    if ( Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Ivy_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            return Ivy_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            return Ivy_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    else if ( Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Ivy_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            return Ivy_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            return Ivy_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    else if ( Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Ivy_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            return Ivy_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            return Ivy_ObjChild1(pNode0);//pNode1->p2;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    else if ( Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Ivy_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            return Ivy_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            return Ivy_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}